

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceField.h
# Opt level: O0

Ref<anurbs::BrepFace> __thiscall anurbs::BrepFaceField<3L>::face(BrepFaceField<3L> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepFace> *in_RSI;
  Ref<anurbs::BrepFace> RVar1;
  BrepFaceField<3L> *this_local;
  
  Ref<anurbs::BrepFace>::Ref(&this->m_face,in_RSI);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepFace>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ref<BrepFace> face() const
    {
        return m_face;
    }